

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

Result __thiscall
testing::internal::FunctionMockerBase<void_(unsigned_short,_unsigned_char)>::PerformDefaultAction
          (FunctionMockerBase<void_(unsigned_short,_unsigned_char)> *this,type args,
          string *call_description)

{
  pointer pcVar1;
  bool bVar2;
  Action<void_(unsigned_short,_unsigned_char)> *this_00;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar3;
  OnCallSpec<void_(unsigned_short,_unsigned_char)> *this_01;
  string message;
  ArgumentTuple local_54;
  long *local_50 [2];
  long local_40 [2];
  
  ppvVar3 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppvVar3 ==
        (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      this_01 = (OnCallSpec<void_(unsigned_short,_unsigned_char)> *)0x0;
      break;
    }
    this_01 = (OnCallSpec<void_(unsigned_short,_unsigned_char)> *)ppvVar3[-1];
    ppvVar3 = ppvVar3 + -1;
    bVar2 = OnCallSpec<void_(unsigned_short,_unsigned_char)>::Matches(this_01,args);
  } while (!bVar2);
  if (this_01 == (OnCallSpec<void_(unsigned_short,_unsigned_char)> *)0x0) {
    pcVar1 = (call_description->_M_dataplus)._M_p;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar1,pcVar1 + call_description->_M_string_length);
    std::__cxx11::string::append((char *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  else {
    this_00 = OnCallSpec<void_(unsigned_short,_unsigned_char)>::GetAction(this_01);
    local_54.super__Tuple_impl<0UL,_unsigned_short,_unsigned_char>.
    super__Tuple_impl<1UL,_unsigned_char>.super__Head_base<1UL,_unsigned_char,_false>._M_head_impl =
         (_Head_base<1UL,_unsigned_char,_false>)
         (args->super__Tuple_impl<0UL,_unsigned_short,_unsigned_char>).
         super__Tuple_impl<1UL,_unsigned_char>.super__Head_base<1UL,_unsigned_char,_false>.
         _M_head_impl;
    local_54.super__Tuple_impl<0UL,_unsigned_short,_unsigned_char>.
    super__Head_base<0UL,_unsigned_short,_false>._M_head_impl =
         (args->super__Tuple_impl<0UL,_unsigned_short,_unsigned_char>).
         super__Head_base<0UL,_unsigned_short,_false>._M_head_impl;
    Action<void_(unsigned_short,_unsigned_char)>::Perform(this_00,&local_54);
  }
  return;
}

Assistant:

Result PerformDefaultAction(
      typename RvalueRef<typename Function<F>::ArgumentTuple>::type args,
      const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != NULL) {
      return spec->GetAction().Perform(internal::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }